

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O2

void __thiscall PRED<UF>::FirstScan(PRED<UF> *this)

{
  long lVar1;
  long lVar2;
  uint *puVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  Mat1i *pMVar7;
  Mat1b *pMVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  uint *puVar16;
  long lVar17;
  char *pcVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar7->field_0x10,0,*(long *)&pMVar7->field_0x20 - *(long *)&pMVar7->field_0x18
        );
  puVar3 = UF::P_;
  *UF::P_ = 0;
  UF::length_ = 1;
  pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar25 = *(int *)&pMVar8->field_0xc;
  iVar6 = *(int *)&pMVar8->field_0x8;
  lVar24 = *(long *)&pMVar8->field_0x10;
  lVar26 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  uVar23 = 0xffffffffffffffff;
  while( true ) {
    lVar22 = (long)(int)uVar23;
    uVar23 = lVar22 + 1;
    if (iVar25 <= (int)uVar23) break;
    if (*(char *)(lVar24 + uVar23) != '\0') {
      puVar3[UF::length_] = UF::length_;
      uVar13 = UF::length_ + 1;
      *(uint *)(lVar26 + 4 + lVar22 * 4) = UF::length_;
      UF::length_ = uVar13;
      uVar23 = lVar22 + 2;
      while( true ) {
        if ((long)iVar25 <= (long)uVar23) goto LAB_00190540;
        if (*(char *)(lVar24 + uVar23) == '\0') break;
        *(undefined4 *)(lVar26 + uVar23 * 4) = *(undefined4 *)(lVar26 + -4 + uVar23 * 4);
        uVar23 = uVar23 + 1;
      }
      uVar23 = uVar23 & 0xffffffff;
    }
  }
LAB_00190540:
  iVar25 = iVar25 + -1;
  lVar22 = (long)iVar25;
  lVar24 = 1;
  lVar26 = 0;
  while( true ) {
    if (iVar6 <= lVar24) {
      return;
    }
    pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar14 = *(long *)&pMVar8->field_0x10;
    lVar9 = **(long **)&pMVar8->field_0x48;
    lVar21 = lVar9 * lVar24;
    lVar2 = lVar14 + lVar21;
    pcVar18 = (char *)(lVar2 - lVar9);
    lVar10 = *(long *)&pMVar7->field_0x10;
    lVar11 = **(long **)&pMVar7->field_0x48;
    lVar27 = lVar11 * lVar24;
    puVar3 = (uint *)(lVar27 + lVar10);
    puVar16 = (uint *)((long)puVar3 - lVar11);
    if (iVar25 != 0) break;
    if (*(char *)(lVar14 + lVar21) != '\0') {
      if (*pcVar18 == '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar13 = UF::length_ + 1;
        *puVar3 = UF::length_;
        UF::length_ = uVar13;
      }
      else {
        *puVar3 = *puVar16;
      }
    }
LAB_00190af6:
    lVar24 = lVar24 + 1;
    lVar26 = lVar26 + 1;
  }
  if (*(char *)(lVar14 + lVar21) == '\0') {
    uVar23 = 0;
    goto LAB_0019066f;
  }
  if (*pcVar18 == '\0') {
    if (pcVar18[1] == '\0') {
      UF::P_[UF::length_] = UF::length_;
      uVar13 = UF::length_ + 1;
      *puVar3 = UF::length_;
      UF::length_ = uVar13;
      lVar15 = 0;
      goto LAB_00190833;
    }
    *puVar3 = puVar16[1];
    uVar23 = 0;
    goto LAB_00190935;
  }
  *puVar3 = *puVar16;
  uVar23 = 0;
LAB_00190969:
  iVar12 = (int)uVar23;
  lVar15 = (long)iVar12;
  lVar17 = lVar15 << 0x20;
  lVar19 = lVar27 + lVar15 * 4;
  lVar28 = 0;
  do {
    if (lVar22 <= lVar15 + 1 + lVar28) {
      lVar14 = lVar17 + 0x100000000 >> 0x20;
      if (*(char *)(lVar2 + lVar14) != '\0') {
        if (pcVar18[lVar14] == '\0') {
LAB_00190aec:
          uVar13 = *(uint *)((long)puVar3 + (lVar17 >> 0x1e));
        }
        else {
          uVar13 = puVar16[lVar14];
        }
        puVar3[lVar14] = uVar13;
      }
      goto LAB_00190af6;
    }
    if (*(char *)(lVar21 + lVar15 + lVar14 + 1 + lVar28) == '\0') {
      uVar23 = (ulong)(iVar12 + (int)lVar28 + 1);
      goto LAB_0019066f;
    }
    if (*(char *)(lVar9 * lVar26 + lVar15 + lVar14 + 1 + lVar28) == '\0') break;
    *(undefined4 *)(lVar10 + 4 + lVar19 + lVar28 * 4) =
         *(undefined4 *)(lVar11 * lVar26 + lVar15 * 4 + lVar10 + 4 + lVar28 * 4);
    lVar17 = lVar17 + 0x100000000;
    lVar28 = lVar28 + 1;
  } while( true );
  lVar20 = lVar17 + 0x200000000 >> 0x20;
  if (pcVar18[lVar20] == '\0') {
    lVar15 = lVar15 + lVar28 + 1;
    *(undefined4 *)(lVar19 + lVar10 + 4 + lVar28 * 4) =
         *(undefined4 *)((long)puVar3 + (lVar17 >> 0x1e));
    goto LAB_00190833;
  }
  uVar23 = (ulong)(iVar12 + (int)lVar28 + 1);
  uVar13 = UF::Merge(*(uint *)((long)puVar3 + (lVar17 >> 0x1e)),puVar16[lVar20]);
  *(uint *)(lVar19 + lVar10 + 4 + lVar28 * 4) = uVar13;
LAB_00190935:
  do {
    lVar15 = (long)(int)uVar23;
    uVar23 = lVar15 + 1;
    cVar5 = *(char *)(lVar2 + 1 + lVar15);
    if (iVar25 <= (int)uVar23) {
      if (cVar5 != '\0') {
        puVar3[lVar15 + 1] = puVar16[lVar15 + 1];
      }
      goto LAB_00190af6;
    }
    if (cVar5 != '\0') {
      puVar3[lVar15 + 1] = puVar16[lVar15 + 1];
      goto LAB_00190969;
    }
LAB_0019066f:
    while( true ) {
      lVar17 = (long)(int)uVar23;
      lVar15 = lVar17 << 0x20;
      lVar19 = 0;
      do {
        lVar28 = lVar15;
        lVar20 = lVar28 >> 0x20;
        if (lVar22 <= lVar17 + lVar19 + 1) {
          lVar14 = lVar28 + 0x100000000 >> 0x20;
          if (*(char *)(lVar2 + lVar14) == '\0') goto LAB_00190af6;
          if (pcVar18[lVar14] == '\0') {
            if (pcVar18[lVar20] == '\0') {
              UF::P_[UF::length_] = UF::length_;
              uVar13 = UF::length_ + 1;
              puVar3[lVar14] = UF::length_;
              UF::length_ = uVar13;
              goto LAB_00190af6;
            }
            uVar13 = puVar16[lVar20];
          }
          else {
            uVar13 = puVar16[lVar14];
          }
          puVar3[lVar14] = uVar13;
          goto LAB_00190af6;
        }
        lVar1 = lVar19 + 1;
        pcVar4 = (char *)(lVar21 + lVar17 + lVar14 + 1 + lVar19);
        lVar15 = lVar28 + 0x100000000;
        lVar19 = lVar1;
      } while (*pcVar4 == '\0');
      uVar23 = (uVar23 & 0xffffffff) + lVar1;
      if (*(char *)(lVar1 + lVar9 * lVar26 + lVar17 + lVar14) != '\0') {
        *(undefined4 *)(lVar27 + lVar17 * 4 + lVar10 + lVar1 * 4) =
             *(undefined4 *)(lVar11 * lVar26 + lVar17 * 4 + lVar10 + lVar1 * 4);
        goto LAB_00190969;
      }
      lVar15 = lVar28 + 0x200000000 >> 0x20;
      if (pcVar18[lVar15] != '\0') break;
      lVar15 = lVar17 + lVar1;
      if (pcVar18[lVar20] == '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar13 = UF::length_ + 1;
        *(uint *)(lVar27 + lVar17 * 4 + lVar10 + lVar1 * 4) = UF::length_;
        UF::length_ = uVar13;
      }
      else {
        *(uint *)(lVar27 + lVar17 * 4 + lVar10 + lVar1 * 4) = puVar16[lVar20];
      }
LAB_00190833:
      iVar12 = (int)lVar15;
      lVar28 = (long)iVar12;
      lVar17 = lVar15 << 0x20;
      lVar15 = lVar27 + lVar28 * 4;
      lVar19 = lVar15 + lVar10;
      lVar20 = 0;
      while( true ) {
        if (lVar22 <= lVar28 + lVar20 + 1) {
          lVar14 = lVar17 + 0x100000000 >> 0x20;
          if (*(char *)(lVar2 + lVar14) == '\0') goto LAB_00190af6;
          goto LAB_00190aec;
        }
        if (*(char *)(lVar21 + lVar28 + lVar14 + 1 + lVar20) == '\0') break;
        if (*(char *)(lVar9 * lVar26 + lVar28 + lVar14 + 2 + lVar20) != '\0') {
          uVar23 = (ulong)(iVar12 + (int)lVar20 + 1);
          uVar13 = UF::Merge(*(uint *)((long)puVar3 + (lVar17 >> 0x1e)),
                             *(uint *)(lVar11 * lVar26 + lVar28 * 4 + lVar10 + 8 + lVar20 * 4));
          *(uint *)(lVar15 + lVar10 + 4 + lVar20 * 4) = uVar13;
          goto LAB_00190935;
        }
        *(undefined4 *)(lVar19 + 4 + lVar20 * 4) = *(undefined4 *)(lVar19 + lVar20 * 4);
        lVar17 = lVar17 + 0x100000000;
        lVar20 = lVar20 + 1;
      }
      uVar23 = (ulong)(iVar12 + (int)lVar20 + 1);
    }
    if (pcVar18[lVar20] == '\0') {
      uVar13 = puVar16[lVar15];
    }
    else {
      uVar13 = UF::Merge(puVar16[lVar20],puVar16[lVar15]);
    }
    *(uint *)(lVar27 + lVar17 * 4 + lVar10 + lVar1 * 4) = uVar13;
  } while( true );
}

Assistant:

void FirstScan()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img_row[c]>0
#define CONDITION_P img_row_prev[c-1]>0
#define CONDITION_Q img_row_prev[c]>0
#define CONDITION_R img_row_prev[c+1]>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#define COLS w

        {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(0);

#include "labeling_grana_2016_forest_0.inc.h"
                
        }

        for (int r = 1; r < h; ++r) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
        
#include "labeling_grana_2016_forest.inc.h"  

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
    }